

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_streams.c
# Opt level: O2

HPDF_STATUS HPDF_Stream_WriteToStreamWithDeflate(HPDF_Stream src,HPDF_Stream dst,HPDF_Encrypt e)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  HPDF_STATUS HVar5;
  HPDF_UINT len;
  HPDF_BYTE *pHVar6;
  HPDF_Error error;
  undefined1 *local_3418;
  HPDF_UINT size;
  HPDF_Stream local_3408;
  HPDF_Stream local_3400;
  z_stream strm;
  HPDF_BYTE local_3388 [4528];
  Bytef inbuf [4096];
  HPDF_BYTE local_11d8 [4520];
  
  HVar5 = HPDF_Stream_Seek(src,0,HPDF_SEEK_SET);
  if (HVar5 != 0) {
    return HVar5;
  }
  local_3418 = (undefined1 *)&local_3418;
  HPDF_MemSet(&strm,'\0',0x70);
  strm.avail_out = 0x11a6;
  strm.next_out = local_11d8;
  iVar3 = deflateInit_(&strm,0xffffffffffffffff,"1.2.11",0x70);
  if (iVar3 == 0) {
    bVar1 = false;
    strm.next_in = inbuf;
    strm.avail_in = 0;
    local_3408 = src;
    local_3400 = dst;
    do {
      size = 0x1000;
      HVar5 = HPDF_Stream_Read(src,inbuf,&size);
      src = local_3408;
      strm.avail_in = size;
      strm.next_in = inbuf;
      if (HVar5 != 0) {
        if (HVar5 != 0x1058) {
          deflateEnd(&strm);
          return HVar5;
        }
        bVar1 = true;
        if (size == 0) break;
      }
      while (strm.avail_in != 0) {
        uVar4 = deflate(&strm,0);
        if (1 < uVar4) goto LAB_0013150b;
        if (strm.avail_out == 0) {
          pHVar6 = local_11d8;
          if (e != (HPDF_Encrypt)0x0) {
            pHVar6 = local_3388;
            HPDF_Encrypt_CryptBuf(e,local_11d8,pHVar6,0x11a6);
          }
          HVar5 = HPDF_Stream_Write(local_3400,pHVar6,0x11a6);
          if (HVar5 != 0) {
            deflateEnd(&strm);
            error = src->error;
            goto LAB_0013153c;
          }
          strm.avail_out = 0x11a6;
          strm.next_out = local_11d8;
        }
      }
      bVar2 = !bVar1;
      bVar1 = !bVar2;
    } while (bVar2);
    while (uVar4 = deflate(&strm,4), uVar4 < 2) {
      if (strm.avail_out < 0x11a6) {
        len = 0x11a6 - strm.avail_out;
        pHVar6 = local_11d8;
        if (e != (HPDF_Encrypt)0x0) {
          HPDF_Encrypt_CryptBuf(e,local_11d8,local_3388,len);
          pHVar6 = local_3388;
        }
        HVar5 = HPDF_Stream_Write(local_3400,pHVar6,len);
        if (HVar5 != 0) {
          deflateEnd(&strm);
          error = src->error;
          goto LAB_0013153c;
        }
        strm.avail_out = 0x11a6;
        strm.next_out = local_11d8;
      }
      if (uVar4 == 1) {
        deflateEnd(&strm);
        return 0;
      }
    }
LAB_0013150b:
    HVar5 = (HPDF_STATUS)(int)uVar4;
    deflateEnd(&strm);
    error = src->error;
  }
  else {
    HVar5 = (HPDF_STATUS)iVar3;
    error = src->error;
  }
LAB_0013153c:
  HVar5 = HPDF_SetError(error,0x1066,HVar5);
  return HVar5;
}

Assistant:

HPDF_STATUS
HPDF_Stream_WriteToStreamWithDeflate  (HPDF_Stream  src,
                                       HPDF_Stream  dst,
                                       HPDF_Encrypt  e)
{
#ifdef LIBHPDF_HAVE_ZLIB

#define DEFLATE_BUF_SIZ  ((HPDF_INT)(HPDF_STREAM_BUF_SIZ * 1.1) + 13)

    HPDF_STATUS ret;
    HPDF_BOOL flg;

    z_stream strm;
    Bytef inbuf[HPDF_STREAM_BUF_SIZ];
    Bytef otbuf[DEFLATE_BUF_SIZ];
    HPDF_BYTE ebuf[DEFLATE_BUF_SIZ];

    HPDF_PTRACE((" HPDF_Stream_WriteToStreamWithDeflate\n"));

    /* initialize input stream */
    ret = HPDF_Stream_Seek (src, 0, HPDF_SEEK_SET);
    if (ret != HPDF_OK)
        return ret;

    /* initialize decompression stream. */
    HPDF_MemSet(&strm, 0x00, sizeof(z_stream));
    strm.next_out = otbuf;
    strm.avail_out = DEFLATE_BUF_SIZ;

    ret = deflateInit_(&strm, Z_DEFAULT_COMPRESSION, ZLIB_VERSION,
            sizeof(z_stream));
    if (ret != Z_OK)
        return HPDF_SetError (src->error, HPDF_ZLIB_ERROR, ret);

    strm.next_in = inbuf;
    strm.avail_in = 0;

    flg = HPDF_FALSE;
    for (;;) {
        HPDF_UINT size = HPDF_STREAM_BUF_SIZ;

        ret = HPDF_Stream_Read (src, inbuf, &size);

        strm.next_in = inbuf;
        strm.avail_in = size;

        if (ret != HPDF_OK) {
            if (ret == HPDF_STREAM_EOF) {
                flg = HPDF_TRUE;
                if (size == 0)
                    break;
            } else {
                deflateEnd(&strm);
                return ret;
            }
        }

        while (strm.avail_in > 0) {
            ret = deflate(&strm, Z_NO_FLUSH);
            if (ret != Z_OK && ret != Z_STREAM_END) {
                deflateEnd(&strm);
                return HPDF_SetError (src->error, HPDF_ZLIB_ERROR, ret);
            }

            if (strm.avail_out == 0) {
                if (e) {
                    HPDF_Encrypt_CryptBuf (e, otbuf, ebuf, DEFLATE_BUF_SIZ);
                    ret = HPDF_Stream_Write(dst, ebuf, DEFLATE_BUF_SIZ);
                } else
                    ret = HPDF_Stream_Write (dst, otbuf, DEFLATE_BUF_SIZ);

                if (ret != HPDF_OK) {
                    deflateEnd(&strm);
                    return HPDF_SetError (src->error, HPDF_ZLIB_ERROR, ret);
                }

                strm.next_out = otbuf;
                strm.avail_out = DEFLATE_BUF_SIZ;
            }
        }

        if (flg)
            break;
    }

    flg = HPDF_FALSE;
    for (;;) {
        ret = deflate(&strm, Z_FINISH);
        if (ret != Z_OK && ret != Z_STREAM_END) {
            deflateEnd(&strm);
            return HPDF_SetError (src->error, HPDF_ZLIB_ERROR, ret);
        }

        if (ret == Z_STREAM_END)
            flg = HPDF_TRUE;

        if (strm.avail_out < DEFLATE_BUF_SIZ) {
            HPDF_UINT osize = DEFLATE_BUF_SIZ - strm.avail_out;
            if (e) {
                HPDF_Encrypt_CryptBuf (e, otbuf, ebuf, osize);
                ret = HPDF_Stream_Write(dst, ebuf, osize);
            } else
                ret = HPDF_Stream_Write (dst, otbuf, osize);

            if (ret != HPDF_OK) {
                deflateEnd(&strm);
                return HPDF_SetError (src->error, HPDF_ZLIB_ERROR, ret);
            }

            strm.next_out = otbuf;
            strm.avail_out = DEFLATE_BUF_SIZ;
        }

        if (flg)
            break;
    }

    deflateEnd(&strm);
    return HPDF_OK;
#else /* LIBHPDF_HAVE_ZLIB */
    HPDF_UNUSED (e);
    HPDF_UNUSED (dst);
    HPDF_UNUSED (src);
    return HPDF_UNSUPPORTED_FUNC;
#endif /* LIBHPDF_HAVE_ZLIB */
}